

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::internal::ArgFormatterBase<fmt::ArgFormatter<char>,_char>::visit_char
          (ArgFormatterBase<fmt::ArgFormatter<char>,_char> *this,int value)

{
  byte bVar1;
  uint uVar2;
  BasicWriter<char> *pBVar3;
  Buffer<char> *pBVar4;
  size_t sVar5;
  FormatSpec *pFVar6;
  Buffer<char> *pBVar7;
  FormatError *this_00;
  Alignment AVar8;
  size_t __len;
  char __tmp;
  size_t __len_1;
  ulong uVar9;
  ulong __n;
  char *__s;
  size_t __len_2;
  size_t __n_00;
  
  pFVar6 = this->spec_;
  if ((pFVar6->type_ != '\0') && (pFVar6->type_ != 'c')) {
    *(byte *)&pFVar6->flags_ = (byte)pFVar6->flags_ | 0x10;
    BasicWriter<char>::write_int<int,fmt::FormatSpec>(this->writer_,value,*pFVar6);
    return;
  }
  AVar8 = (pFVar6->super_AlignSpec).align_;
  if ((AVar8 == ALIGN_NUMERIC) || (pFVar6->flags_ != 0)) {
    this_00 = (FormatError *)__cxa_allocate_exception(0x10);
    FormatError::FormatError(this_00,(CStringRef)0x15534a);
    __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
  }
  uVar9 = (ulong)(pFVar6->super_AlignSpec).super_WidthSpec.width_;
  pBVar3 = this->writer_;
  if (uVar9 < 2) {
    pBVar4 = pBVar3->buffer_;
    sVar5 = pBVar4->size_;
    uVar9 = sVar5 + 1;
    pBVar7 = pBVar4;
    if (pBVar4->capacity_ < uVar9) {
      (**pBVar4->_vptr_Buffer)(pBVar4,uVar9);
      pBVar7 = pBVar3->buffer_;
    }
    pBVar4->size_ = uVar9;
    __s = pBVar7->ptr_ + sVar5;
    goto LAB_00142c30;
  }
  bVar1 = (byte)(pFVar6->super_AlignSpec).super_WidthSpec.fill_;
  pBVar4 = pBVar3->buffer_;
  sVar5 = pBVar4->size_;
  uVar9 = uVar9 + sVar5;
  pBVar7 = pBVar4;
  if (pBVar4->capacity_ < uVar9) {
    (**pBVar4->_vptr_Buffer)(pBVar4,uVar9);
    pBVar7 = pBVar3->buffer_;
    pFVar6 = this->spec_;
    AVar8 = (pFVar6->super_AlignSpec).align_;
  }
  pBVar4->size_ = uVar9;
  __s = pBVar7->ptr_ + sVar5;
  uVar2 = (pFVar6->super_AlignSpec).super_WidthSpec.width_;
  if (AVar8 == ALIGN_CENTER) {
    uVar9 = (ulong)uVar2 - 1;
    __n = uVar9 >> 1;
    if (1 < uVar9) {
      memset(__s,(uint)bVar1,__n);
    }
    __s = __s + __n;
    if (uVar2 == 1) goto LAB_00142c30;
    __n_00 = uVar9 - __n;
  }
  else {
    if (AVar8 == ALIGN_RIGHT) {
      if (uVar2 - 1 == 0) {
        uVar9 = 0;
      }
      else {
        memset(__s,(uint)bVar1,(ulong)(uVar2 - 1));
        uVar9 = (ulong)((this->spec_->super_AlignSpec).super_WidthSpec.width_ - 1);
      }
      __s = __s + uVar9;
      goto LAB_00142c30;
    }
    if (uVar2 - 1 == 0) goto LAB_00142c30;
    __n_00 = (size_t)(uVar2 - 1);
  }
  memset(__s + 1,(uint)bVar1,__n_00);
LAB_00142c30:
  *__s = (char)value;
  return;
}

Assistant:

void visit_char(int value) {
    if (spec_.type_ && spec_.type_ != 'c') {
      spec_.flags_ |= CHAR_FLAG;
      writer_.write_int(value, spec_);
      return;
    }
    if (spec_.align_ == ALIGN_NUMERIC || spec_.flags_ != 0)
      FMT_THROW(FormatError("invalid format specifier for char"));
    typedef typename BasicWriter<Char>::CharPtr CharPtr;
    Char fill = internal::CharTraits<Char>::cast(spec_.fill());
    CharPtr out = CharPtr();
    const unsigned CHAR_SIZE = 1;
    if (spec_.width_ > CHAR_SIZE) {
      out = writer_.grow_buffer(spec_.width_);
      if (spec_.align_ == ALIGN_RIGHT) {
        std::uninitialized_fill_n(out, spec_.width_ - CHAR_SIZE, fill);
        out += spec_.width_ - CHAR_SIZE;
      } else if (spec_.align_ == ALIGN_CENTER) {
        out = writer_.fill_padding(out, spec_.width_,
                                   internal::const_check(CHAR_SIZE), fill);
      } else {
        std::uninitialized_fill_n(out + CHAR_SIZE,
                                  spec_.width_ - CHAR_SIZE, fill);
      }
    } else {
      out = writer_.grow_buffer(CHAR_SIZE);
    }
    *out = internal::CharTraits<Char>::cast(value);
  }